

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O2

CRuleSet * __thiscall
allocator_default<CTilesetMapper::CRuleSet>::alloc_array
          (allocator_default<CTilesetMapper::CRuleSet> *this,int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_> *this_00;
  long lVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(int)this;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar2 = SUB168(auVar1 * ZEXT816(0x98),0);
  uVar4 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar4 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x98),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar4);
  *puVar3 = uVar6;
  if ((int)this != 0) {
    this_00 = (array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_> *)
              (puVar3 + 0x12);
    lVar5 = 0;
    do {
      array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::init
                (this_00,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,size));
      lVar5 = lVar5 + -0x98;
      this_00 = (array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_> *)
                &this_00[9].list_size;
    } while (uVar6 * -0x98 - lVar5 != 0);
  }
  return (CRuleSet *)(puVar3 + 1);
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }